

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O0

Token * __thiscall embree::TokenStream::next(TokenStream *this)

{
  bool bVar1;
  Token *pTVar2;
  ParseLocation *in_RSI;
  Token *in_RDI;
  ParseLocation loc;
  Token token;
  ParseLocation *in_stack_00000210;
  Token *in_stack_00000218;
  TokenStream *in_stack_00000220;
  Token *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  TokenStream *in_stack_fffffffffffffed8;
  char c;
  Stream<int> *in_stack_ffffffffffffff48;
  ParseLocation *in_stack_ffffffffffffff58;
  Token *in_stack_ffffffffffffff60;
  TokenStream *in_stack_ffffffffffffff68;
  ParseLocation *loc_00;
  TokenStream *in_stack_ffffffffffffffe8;
  
  loc_00 = in_RSI;
  pTVar2 = in_RDI;
  ParseLocation::ParseLocation
            ((ParseLocation *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  Token::Token((Token *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (ParseLocation *)in_stack_fffffffffffffec8);
  ParseLocation::~ParseLocation((ParseLocation *)0x47c414);
  skipSeparators(in_stack_fffffffffffffed8);
  Stream<int>::loc(in_stack_ffffffffffffff48);
  ParseLocation::ParseLocation
            ((ParseLocation *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             (ParseLocation *)in_stack_fffffffffffffec8);
  bVar1 = trySymbols(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    Token::Token((Token *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 in_stack_fffffffffffffec8);
  }
  else {
    bVar1 = tryFloat(in_stack_00000220,in_stack_00000218,in_stack_00000210);
    if (bVar1) {
      Token::Token((Token *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                   in_stack_fffffffffffffec8);
    }
    else {
      bVar1 = tryInt(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        Token::Token((Token *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                     in_stack_fffffffffffffec8);
      }
      else {
        bVar1 = tryString((TokenStream *)loc.colNumber,(Token *)loc.lineNumber,
                          (ParseLocation *)
                          loc.fileName.
                          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi);
        if (bVar1) {
          Token::Token((Token *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       in_stack_fffffffffffffec8);
        }
        else {
          bVar1 = tryIdentifier(in_stack_ffffffffffffffe8,pTVar2,loc_00);
          if (bVar1) {
            Token::Token((Token *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         in_stack_fffffffffffffec8);
          }
          else {
            pTVar2 = (Token *)Stream<int>::peek(in_stack_ffffffffffffff48);
            if (pTVar2->ty == ~TY_EOF) {
              Token::Token((Token *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           (ParseLocation *)in_stack_fffffffffffffec8);
            }
            else {
              c = (char)((ulong)in_RSI[2].fileName.
                                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr >> 0x38);
              in_stack_fffffffffffffed4 = Stream<int>::get(in_stack_ffffffffffffff48);
              Token::Token(pTVar2,c,(ParseLocation *)
                                    CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
            }
          }
        }
      }
    }
  }
  ParseLocation::~ParseLocation((ParseLocation *)0x47c6db);
  Token::~Token((Token *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  return in_RDI;
}

Assistant:

Token TokenStream::next()
  {
    Token token;
    skipSeparators();
    ParseLocation loc = cin->loc();
    if (trySymbols   (token,loc)) return token;      /**< try to parse a symbol */
    if (tryFloat     (token,loc)) return token;      /**< try to parse float */
    if (tryInt       (token,loc)) return token;      /**< try to parse integer */
    if (tryString    (token,loc)) return token;      /**< try to parse string */
    if (tryIdentifier(token,loc)) return token;      /**< try to parse identifier */
    if (cin->peek() == EOF  )     return Token(loc); /**< return EOF token */
    return Token((char)cin->get(),loc);              /**< return invalid character token */
  }